

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::LICMPass::ProcessIRContext(LICMPass *this)

{
  bool bVar1;
  Status b;
  reference f;
  iterator local_40;
  undefined1 local_30 [8];
  iterator func;
  Module *module;
  Status status;
  LICMPass *this_local;
  
  module._4_4_ = SuccessWithoutChange;
  func.iterator_._M_current =
       (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *)
       Pass::get_module(&this->super_Pass);
  _local_30 = Module::begin((Module *)func.iterator_._M_current);
  while( true ) {
    local_40 = Module::end((Module *)func.iterator_._M_current);
    bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)local_30,&local_40);
    if (!bVar1 || module._4_4_ == Failure) break;
    f = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                  ((UptrVectorIterator<spvtools::opt::Function,_false> *)local_30);
    b = ProcessFunction(this,f);
    module._4_4_ = CombineStatus(module._4_4_,b);
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)local_30);
  }
  return module._4_4_;
}

Assistant:

Pass::Status LICMPass::ProcessIRContext() {
  Status status = Status::SuccessWithoutChange;
  Module* module = get_module();

  // Process each function in the module
  for (auto func = module->begin();
       func != module->end() && status != Status::Failure; ++func) {
    status = CombineStatus(status, ProcessFunction(&*func));
  }
  return status;
}